

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void __thiscall djb::tab_r::compute_cdf(tab_r *this)

{
  pointer *ppvVar1;
  undefined8 uVar2;
  iterator iVar3;
  int i2;
  int iVar4;
  long lVar5;
  long lVar6;
  int i1;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float extraout_XMM0_Da;
  float fVar11;
  vec2 local_60;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  long local_40;
  long local_38;
  
  lVar6 = 0;
  lVar5 = 0;
  do {
    fVar8 = SQRT((float)(int)lVar5 / 15.0) * 3.1415927 * 0.5;
    local_40 = lVar5;
    fVar9 = cosf(fVar8);
    fVar10 = 0.0;
    if (0.0 <= fVar9) {
      fVar10 = fVar9;
    }
    local_54 = sinf(fVar8);
    iVar4 = 0x40;
    do {
      local_60.x = 0.0;
      local_60.y = 0.0;
      iVar3._M_current =
           (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<djb::vec2,_std::allocator<djb::vec2>_>::_M_realloc_insert<djb::vec2>
                  (&this->m_cdf,iVar3,&local_60);
      }
      else {
        (iVar3._M_current)->x = 0.0;
        (iVar3._M_current)->y = 0.0;
        ppvVar1 = &(this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppvVar1 = *ppvVar1 + 1;
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    local_58 = 1.0;
    if (fVar10 <= 1.0) {
      local_58 = fVar10;
    }
    lVar5 = 1;
    local_38 = lVar6;
    do {
      local_48 = (float)(int)lVar5 * 0.00390625;
      fVar10 = local_48 * local_48 * 3.1415927 * 0.5;
      fVar8 = cosf(fVar10);
      local_4c = sinf(fVar10);
      (*(this->super_radial).super_microfacet.super_brdf._vptr_brdf[0xe])((ulong)(uint)fVar8,this);
      fVar10 = 0.0;
      fVar8 = fVar8 * local_58;
      lVar7 = 0;
      local_50 = extraout_XMM0_Da;
      do {
        fVar9 = (float)(int)lVar7 * 0.015625;
        local_44 = (fVar9 + fVar9 + -1.0) * 3.1415927;
        fVar9 = cosf(local_44);
        fVar11 = sinf(local_44);
        fVar11 = fVar9 * local_4c * local_54 + fVar11 * local_4c * 0.0 + fVar8;
        fVar9 = 0.0;
        if (0.0 <= fVar11) {
          fVar9 = fVar11;
        }
        fVar11 = 1.0;
        if (fVar9 <= 1.0) {
          fVar11 = fVar9;
        }
        fVar9 = fVar11 * local_50 * local_48 * local_4c;
        fVar10 = fVar9 + fVar10;
        uVar2 = *(undefined8 *)
                 ((long)&(this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar7].x + lVar6);
        local_60.x = fVar10 * 0.024543693 * 0.049087387 + (float)uVar2;
        local_60.y = fVar9 * 0.049087387 + (float)((ulong)uVar2 >> 0x20);
        iVar3._M_current =
             (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<djb::vec2,_std::allocator<djb::vec2>_>::_M_realloc_insert<djb::vec2>
                    (&this->m_cdf,iVar3,&local_60);
        }
        else {
          *iVar3._M_current = local_60;
          ppvVar1 = &(this->m_cdf).super__Vector_base<djb::vec2,_std::allocator<djb::vec2>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppvVar1 = *ppvVar1 + 1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x200;
    } while (lVar5 != 0x100);
    lVar5 = local_40 + 1;
    lVar6 = local_38 + 0x20000;
  } while (lVar5 != 0x10);
  fwrite("djb_verbose: CDF ready\n",0x17,1,_stdout);
  return;
}

Assistant:

void tab_r::compute_cdf()
{
	int nti = 16;
	int nu2 = 256;
	int nu1 = 64;
	double du2 = (double)m_pi() / nu1;
	double du1 = 2 * (double)m_pi() / nu2;

	for (int i3 = 0; i3 < nti; ++i3) {
		float_t u = (float_t)i3 / (nti - 1); // in [0,1]
		float_t ti = sqrt(u) * m_pi() / 2;     // in [0,pi/2]
		float_t zi = sat(cos(ti)), z_i = sin(ti);
		vec3 wi = vec3(z_i, 0, zi);

		// bottom row (zeroes)
		for (int i1 = 0; i1 < nu1; ++i1)
			m_cdf.push_back(vec2(0));

		// rest of the domain
		for (int i2 = 1; i2 < nu2; ++i2) {
			float_t u2 = (float_t)i2 / nu2;   // in (0,1)
			float_t tm = sqr(u2) * m_pi() / 2;  // in [0,pi/2)
			float_t ctm = cos(tm), stm = sin(tm);
			float_t ndf = ndf_std_radial(ctm);
			double nint = 0;

			for (int i1 = 0; i1 < nu1; ++i1) {
				float_t u1 = (float_t)i1 / nu1;    // in [0,1)
				float_t pm = (2 * u1 - 1) * m_pi();  // in [-pi,pi)
				float_t cpm = cos(pm), spm = sin(pm);
				vec3 wm = vec3(stm * cpm, stm * spm, ctm);
				float_t dp = sat(dot(wm, wi));
				vec2 nint2 = m_cdf[i1 + nu1 * (i2 - 1 + nu2 * i3)];
				float_t tmp = dp * ndf * u2 * stm;

				nint+= (double)tmp;
				m_cdf.push_back(vec2(nint * du1, tmp) * du2 + nint2);
			}
		}
	}

#ifndef NVERBOSE
	DJB_LOG("djb_verbose: CDF ready\n");
#endif
}